

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::MinMaxState<long>,long,duckdb::MaxOperation>
               (long *idata,AggregateInputData *aggr_input_data,MinMaxState<long> **states,
               SelectionVector *isel,SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  MinMaxState<long> *pMVar1;
  long lVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  ulong uVar6;
  idx_t row_idx;
  idx_t i;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    psVar3 = isel->sel_vector;
    psVar4 = ssel->sel_vector;
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      uVar8 = uVar6;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar6];
      }
      uVar9 = uVar6;
      if (psVar4 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar4[uVar6];
      }
      pMVar1 = states[uVar9];
      lVar2 = idata[uVar8];
      if (pMVar1->isset == false) {
        pMVar1->value = lVar2;
        pMVar1->isset = true;
      }
      else if (pMVar1->value < lVar2) {
        pMVar1->value = lVar2;
      }
    }
  }
  else {
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      row_idx = iVar7;
      if (isel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)isel->sel_vector[iVar7];
      }
      iVar10 = iVar7;
      if (ssel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)ssel->sel_vector[iVar7];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar5) {
        pMVar1 = states[iVar10];
        lVar2 = idata[row_idx];
        if (pMVar1->isset == false) {
          pMVar1->value = lVar2;
          pMVar1->isset = true;
        }
        else if (pMVar1->value < lVar2) {
          pMVar1->value = lVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}